

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper.h
# Opt level: O1

int __thiscall spdlog::details::file_helper::open(file_helper *this,char *__file,int __oflag,...)

{
  pointer pcVar1;
  int iVar2;
  FILE *pFVar3;
  FILE *extraout_RAX;
  FILE *pFVar4;
  int *piVar5;
  spdlog_ex *this_00;
  long *plVar6;
  ulong uVar7;
  size_type *psVar8;
  int iVar9;
  char *__end;
  char *pcVar10;
  string local_a0;
  char *local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = __file;
  if ((FILE *)this->fd_ != (FILE *)0x0) {
    fclose((FILE *)this->fd_);
    this->fd_ = (FILE *)0x0;
  }
  pcVar10 = "ab";
  local_78 = "ab";
  if ((char)__oflag != '\0') {
    local_78 = "wb";
  }
  std::__cxx11::string::_M_assign((string *)&this->_filename);
  if (0 < this->open_tries) {
    if ((char)__oflag != '\0') {
      pcVar10 = "wb";
    }
    iVar9 = 0;
    do {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,local_78,pcVar10 + 2);
      pFVar3 = fopen(*(char **)local_80,local_a0._M_dataplus._M_p);
      this->fd_ = (FILE *)pFVar3;
      pFVar4 = pFVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        pFVar4 = extraout_RAX;
      }
      if (pFVar3 != (FILE *)0x0) {
        return (int)pFVar4;
      }
      uVar7 = (ulong)this->open_interval;
      if (0 < (long)uVar7) {
        local_a0._M_dataplus._M_p = (pointer)(uVar7 / 1000);
        local_a0._M_string_length = (uVar7 % 1000) * 1000000;
        do {
          iVar2 = nanosleep((timespec *)&local_a0,(timespec *)&local_a0);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < this->open_tries);
  }
  this_00 = (spdlog_ex *)__cxa_allocate_exception(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->_filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->_filename)._M_string_length);
  std::operator+(&local_50,"Failed opening file ",&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_a0._M_dataplus._M_p = (pointer)*plVar6;
  psVar8 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar8) {
    local_a0.field_2._M_allocated_capacity = *psVar8;
    local_a0.field_2._8_8_ = plVar6[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar8;
  }
  local_a0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  piVar5 = __errno_location();
  spdlog_ex::spdlog_ex(this_00,&local_a0,*piVar5);
  __cxa_throw(this_00,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

void open(const filename_t &fname, bool truncate = false)
    {
        close();
        auto *mode = truncate ? SPDLOG_FILENAME_T("wb") : SPDLOG_FILENAME_T("ab");
        _filename = fname;
        for (int tries = 0; tries < open_tries; ++tries)
        {
            if (!os::fopen_s(&fd_, fname, mode))
            {
                return;
            }

            details::os::sleep_for_millis(open_interval);
        }

        throw spdlog_ex("Failed opening file " + os::filename_to_str(_filename) + " for writing", errno);
    }